

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

AActor * P_LinePickActor(AActor *t1,DAngle *angle,double distance,DAngle *pitch,
                        ActorFlags *actorMask,DWORD wallMask)

{
  player_t *ppVar1;
  double dVar2;
  bool bVar3;
  AActor *pAVar4;
  AActor *pAVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  ActorFlags local_17c;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  double local_138;
  AActor *local_128;
  undefined4 local_11c;
  DVector3 local_118;
  FTraceResults trace;
  
  dVar2 = TAngle<double>::Cos(pitch);
  local_158._8_4_ = extraout_XMM0_Dc;
  local_158._0_8_ = dVar2;
  local_158._12_4_ = extraout_XMM0_Dd;
  dVar2 = TAngle<double>::Cos(angle);
  local_168._8_4_ = extraout_XMM0_Dc_00;
  local_168._0_8_ = dVar2;
  local_168._12_4_ = extraout_XMM0_Dd_00;
  dVar2 = TAngle<double>::Sin(angle);
  local_178._8_4_ = extraout_XMM0_Dc_01;
  local_178._0_8_ = dVar2;
  local_178._12_4_ = extraout_XMM0_Dd_01;
  local_138 = TAngle<double>::Sin(pitch);
  local_138 = -local_138;
  local_148._8_4_ = SUB84((double)local_178._0_8_ * (double)local_158._0_8_,0);
  local_148._0_8_ = (double)local_168._0_8_ * (double)local_158._0_8_;
  local_148._12_4_ = (int)((ulong)((double)local_178._0_8_ * (double)local_158._0_8_) >> 0x20);
  ppVar1 = t1->player;
  if (ppVar1 == (player_t *)0x0) {
    local_118.Z = 8.0;
  }
  else {
    local_118.Z = ppVar1->mo->AttackZOffset * ppVar1->crouchfactor;
  }
  local_118.Z = (((t1->__Pos).Z + t1->Height * 0.5) - t1->Floorclip) + local_118.Z;
  local_11c = 1;
  local_118.X = (t1->__Pos).X;
  local_118.Y = (t1->__Pos).Y;
  local_17c = (ActorFlags)actorMask->Value;
  local_128 = t1;
  bVar3 = Trace(&local_118,(sector_t_conflict *)t1->Sector,(DVector3 *)local_148,distance,&local_17c
                ,wallMask,t1,&trace,9,CheckForActor,&local_128);
  pAVar5 = (AActor *)0x0;
  if (trace.HitType == TRACE_HitActor) {
    pAVar5 = trace.Actor;
  }
  pAVar4 = (AActor *)0x0;
  if (bVar3) {
    pAVar4 = pAVar5;
  }
  return pAVar4;
}

Assistant:

AActor *P_LinePickActor(AActor *t1, DAngle angle, double distance, DAngle pitch, ActorFlags actorMask, DWORD wallMask) 
{
	DVector3 direction;
	double shootz;

	double pc = pitch.Cos();
	direction = { pc * angle.Cos(), pc * angle.Sin(), -pitch.Sin() };
	shootz = t1->Center() - t1->Floorclip;

	if (t1->player != NULL)
	{
		shootz += t1->player->mo->AttackZOffset * t1->player->crouchfactor;
	}
	else
	{
		shootz += 8;
	}

	FTraceResults trace;
	Origin TData;
	
	TData.Caller = t1;
	TData.hitGhosts = true;
	TData.MThruSpecies = false;
	TData.ThruActors = false;
	TData.ThruSpecies = false;
	
	if (Trace(t1->PosAtZ(shootz), t1->Sector, direction, distance,
		actorMask, wallMask, t1, trace, TRACE_NoSky | TRACE_PortalRestrict, CheckForActor, &TData))
	{
		if (trace.HitType == TRACE_HitActor)
		{
			return trace.Actor;
		}
	}

	return NULL;
}